

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_1d_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1fcb67d::BlendA64Mask1DTestHBD_RandomValues_Test::TestBody
          (BlendA64Mask1DTestHBD_RandomValues_Test *this)

{
  ACMRandom *this_00;
  int iVar1;
  uint32_t uVar2;
  int bsize;
  int block_size;
  long lVar3;
  uint32_t uVar4;
  
  this_00 = &(this->super_BlendA64Mask1DTestHBD).
             super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
             .
             super_FunctionEquivalenceTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int)>
             .rng_;
  (this->super_BlendA64Mask1DTestHBD).bit_depth_ = 8;
  block_size = 0;
  do {
    do {
      uVar4 = 1 << ((byte)(this->super_BlendA64Mask1DTestHBD).bit_depth_ & 0x1f);
      lVar3 = 0x3c024;
      do {
        uVar2 = testing::internal::Random::Generate(&this_00->random_,uVar4);
        *(short *)((long)this + lVar3 * 2 + -0x78010) = (short)uVar2;
        uVar2 = testing::internal::Random::Generate(&this_00->random_,uVar4);
        *(short *)((long)this + lVar3 * 2 + -0x50010) = (short)uVar2;
        uVar2 = testing::internal::Random::Generate(&this_00->random_,uVar4);
        *(short *)((long)this + lVar3 * 2 + -0x28008) = (short)uVar2;
        uVar2 = testing::internal::Random::Generate(&this_00->random_,uVar4);
        (this->super_BlendA64Mask1DTestHBD).
        super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
        .dst_ref_[lVar3 + -0x1c] = (unsigned_short)uVar2;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x50024);
      lVar3 = 0xa0050;
      do {
        uVar4 = testing::internal::Random::Generate(&this_00->random_,0x41);
        *(char *)((long)(this->super_BlendA64Mask1DTestHBD).
                        super_BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                        .dst_ref_ + lVar3 + -0x38) = (char)uVar4;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xa0150);
      BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
      ::Common((BlendA64Mask1DTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_int,_int,_int),_unsigned_short>
                *)this,block_size);
      block_size = block_size + 1;
    } while (block_size != 0x16);
    iVar1 = (this->super_BlendA64Mask1DTestHBD).bit_depth_;
    (this->super_BlendA64Mask1DTestHBD).bit_depth_ = iVar1 + 2;
    block_size = 0;
  } while (iVar1 < 0xb);
  return;
}

Assistant:

TEST_P(BlendA64Mask1DTestHBD, RandomValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      const int hi = 1 << bit_depth_;

      for (int i = 0; i < kBufSize; ++i) {
        dst_ref_[i] = rng_(hi);
        dst_tst_[i] = rng_(hi);
        src0_[i] = rng_(hi);
        src1_[i] = rng_(hi);
      }

      for (int i = 0; i < kMaxMaskSize; ++i)
        mask_[i] = rng_(AOM_BLEND_A64_MAX_ALPHA + 1);

      Common(bsize);
    }
  }
}